

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

int rnndec_varaddvalue(rnndeccontext *ctx,char *varset,uint64_t value)

{
  int iVar1;
  rnnenum *prVar2;
  rnndecvariant *prVar3;
  rnndecvariant **pprVar4;
  rnndecvariant *ci;
  int i;
  rnnenum *en;
  uint64_t value_local;
  char *varset_local;
  rnndeccontext *ctx_local;
  
  prVar2 = rnn_findenum(ctx->db,varset);
  if (prVar2 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    for (ci._4_4_ = 0; ci._4_4_ < prVar2->valsnum; ci._4_4_ = ci._4_4_ + 1) {
      if ((prVar2->vals[ci._4_4_]->valvalid != 0) && (prVar2->vals[ci._4_4_]->value == value)) {
        prVar3 = (rnndecvariant *)calloc(0x10,1);
        prVar3->en = prVar2;
        prVar3->variant = ci._4_4_;
        if (ctx->varsmax <= ctx->varsnum) {
          if (ctx->varsmax == 0) {
            ctx->varsmax = 0x10;
          }
          else {
            ctx->varsmax = ctx->varsmax << 1;
          }
          pprVar4 = (rnndecvariant **)realloc(ctx->vars,(long)ctx->varsmax << 3);
          ctx->vars = pprVar4;
        }
        iVar1 = ctx->varsnum;
        ctx->varsnum = iVar1 + 1;
        ctx->vars[iVar1] = prVar3;
        return 1;
      }
    }
    fprintf(_stderr,"Value %lx doesn\'t exist in enum %s!\n",value,varset);
  }
  return 0;
}

Assistant:

int rnndec_varaddvalue(struct rnndeccontext *ctx, char *varset, uint64_t value)
{
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (en->vals[i]->valvalid && en->vals[i]->value == value) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}

	fprintf (stderr, "Value %"PRIx64" doesn't exist in enum %s!\n", value, varset);
	return 0;
}